

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBooleanStateQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::BooleanStateQueryTests::init
          (BooleanStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  undefined1 uVar1;
  undefined4 uVar2;
  TestContext *pTVar3;
  Context *pCVar4;
  int iVar5;
  IsEnabledVerifier *this_00;
  undefined4 extraout_var;
  GetBooleanVerifier *this_01;
  undefined4 extraout_var_00;
  GetIntegerVerifier *this_02;
  undefined4 extraout_var_01;
  GetInteger64Verifier *this_03;
  undefined4 extraout_var_02;
  StateVerifier *pSVar6;
  undefined4 extraout_var_03;
  undefined **ppuVar7;
  ApiCase *pAVar8;
  InitialBooleanTestCase *pIVar9;
  TransformFeedbackTestCase *pTVar10;
  int _verifierNdx;
  long lVar11;
  long lVar12;
  allocator<char> local_e9;
  BooleanStateQueryTests *local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  ApiCase *local_a0;
  StateVerifier *normalVerifiers [4];
  StateVerifier *isEnabledVerifiers [5];
  
  this_00 = (IsEnabledVerifier *)operator_new(0x28);
  iVar5 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  BooleanStateQueryVerifiers::IsEnabledVerifier::IsEnabledVerifier
            (this_00,(Functions *)CONCAT44(extraout_var,iVar5),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  this->m_verifierIsEnabled = this_00;
  this_01 = (GetBooleanVerifier *)operator_new(0x28);
  iVar5 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  BooleanStateQueryVerifiers::GetBooleanVerifier::GetBooleanVerifier
            (this_01,(Functions *)CONCAT44(extraout_var_00,iVar5),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  this->m_verifierBoolean = this_01;
  this_02 = (GetIntegerVerifier *)operator_new(0x28);
  iVar5 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  BooleanStateQueryVerifiers::GetIntegerVerifier::GetIntegerVerifier
            (this_02,(Functions *)CONCAT44(extraout_var_01,iVar5),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  this->m_verifierInteger = this_02;
  this_03 = (GetInteger64Verifier *)operator_new(0x28);
  iVar5 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  BooleanStateQueryVerifiers::GetInteger64Verifier::GetInteger64Verifier
            (this_03,(Functions *)CONCAT44(extraout_var_02,iVar5),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  this->m_verifierInteger64 = this_03;
  pSVar6 = (StateVerifier *)operator_new(0x28);
  iVar5 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  BooleanStateQueryVerifiers::GetFloatVerifier::GetFloatVerifier
            ((GetFloatVerifier *)pSVar6,(Functions *)CONCAT44(extraout_var_03,iVar5),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  this->m_verifierFloat = (GetFloatVerifier *)pSVar6;
  isEnabledVerifiers[0] = &this->m_verifierIsEnabled->super_StateVerifier;
  ppuVar7 = (undefined **)this->m_verifierBoolean;
  isEnabledVerifiers[1] = (StateVerifier *)ppuVar7;
  isEnabledVerifiers[2] = &this->m_verifierInteger->super_StateVerifier;
  isEnabledVerifiers[3] = &this->m_verifierInteger64->super_StateVerifier;
  isEnabledVerifiers[4] = pSVar6;
  normalVerifiers[0] = (StateVerifier *)ppuVar7;
  normalVerifiers[1] = &this->m_verifierInteger->super_StateVerifier;
  normalVerifiers[2] = &this->m_verifierInteger64->super_StateVerifier;
  normalVerifiers[3] = pSVar6;
  local_e8 = this;
  for (lVar12 = 0; lVar12 != 0xb; lVar12 = lVar12 + 1) {
    ppuVar7 = &PTR_anon_var_dwarf_1b752e8_01e33490;
    for (lVar11 = 0; lVar11 != 5; lVar11 = lVar11 + 1) {
      pTVar3 = (TestContext *)isEnabledVerifiers[lVar11];
      local_a0 = (ApiCase *)operator_new(0xa8);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,(&PTR_anon_var_dwarf_1b752e8_01e33490)[lVar12 * 3],&local_e9);
      std::operator+(&local_e0,&local_c0,(char *)pTVar3->m_watchDog);
      pAVar8 = local_a0;
      uVar2 = (&DAT_01e334a0)[lVar12 * 6];
      uVar1 = (&DAT_01e334a4)[lVar12 * 0x18];
      ApiCase::ApiCase(local_a0,pCVar4,local_e0._M_dataplus._M_p,(char *)(&DAT_01e33498)[lVar12 * 3]
                      );
      this = local_e8;
      (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_01e33660;
      *(undefined4 *)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = uVar2;
      *(undefined1 *)
       ((long)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = uVar1;
      pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = pTVar3;
      tcu::TestNode::addChild((TestNode *)local_e8,(TestNode *)pAVar8);
      std::__cxx11::string::~string((string *)&local_e0);
      ppuVar7 = (undefined **)std::__cxx11::string::~string((string *)&local_c0);
    }
  }
  for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
    pSVar6 = normalVerifiers[lVar12];
    pAVar8 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"color_writemask",&local_e9);
    std::operator+(&local_e0,&local_c0,pSVar6->m_testNamePostfix);
    ApiCase::ApiCase(pAVar8,pCVar4,local_e0._M_dataplus._M_p,"COLOR_WRITEMASK");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_01e336b8;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pSVar6;
    tcu::TestNode::addChild((TestNode *)local_e8,(TestNode *)pAVar8);
    std::__cxx11::string::~string((string *)&local_e0);
    ppuVar7 = (undefined **)std::__cxx11::string::~string((string *)&local_c0);
    this = local_e8;
  }
  for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
    pSVar6 = normalVerifiers[lVar12];
    pAVar8 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"depth_writemask",&local_e9);
    std::operator+(&local_e0,&local_c0,pSVar6->m_testNamePostfix);
    ApiCase::ApiCase(pAVar8,pCVar4,local_e0._M_dataplus._M_p,"DEPTH_WRITEMASK");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_01e33710;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pSVar6;
    tcu::TestNode::addChild((TestNode *)local_e8,(TestNode *)pAVar8);
    std::__cxx11::string::~string((string *)&local_e0);
    ppuVar7 = (undefined **)std::__cxx11::string::~string((string *)&local_c0);
    this = local_e8;
  }
  for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
    pSVar6 = normalVerifiers[lVar12];
    pAVar8 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"sample_coverage_invert",&local_e9);
    std::operator+(&local_e0,&local_c0,pSVar6->m_testNamePostfix);
    ApiCase::ApiCase(pAVar8,pCVar4,local_e0._M_dataplus._M_p,"SAMPLE_COVERAGE_INVERT");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_01e33768;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pSVar6;
    tcu::TestNode::addChild((TestNode *)local_e8,(TestNode *)pAVar8);
    std::__cxx11::string::~string((string *)&local_e0);
    ppuVar7 = (undefined **)std::__cxx11::string::~string((string *)&local_c0);
    this = local_e8;
  }
  for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
    pSVar6 = normalVerifiers[lVar12];
    pIVar9 = (InitialBooleanTestCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"shader_compiler",&local_e9);
    std::operator+(&local_e0,&local_c0,pSVar6->m_testNamePostfix);
    Functional::anon_unknown_0::InitialBooleanTestCase::InitialBooleanTestCase
              (pIVar9,pCVar4,pSVar6,local_e0._M_dataplus._M_p,"SHADER_COMPILER",0x8dfa,true);
    tcu::TestNode::addChild((TestNode *)local_e8,(TestNode *)pIVar9);
    std::__cxx11::string::~string((string *)&local_e0);
    ppuVar7 = (undefined **)std::__cxx11::string::~string((string *)&local_c0);
    this = local_e8;
  }
  for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
    pSVar6 = normalVerifiers[lVar12];
    pIVar9 = (InitialBooleanTestCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"transform_feedback_active_initial",&local_e9);
    std::operator+(&local_e0,&local_c0,pSVar6->m_testNamePostfix);
    Functional::anon_unknown_0::InitialBooleanTestCase::InitialBooleanTestCase
              (pIVar9,pCVar4,pSVar6,local_e0._M_dataplus._M_p,"initial TRANSFORM_FEEDBACK_ACTIVE",
               0x8e24,false);
    tcu::TestNode::addChild((TestNode *)local_e8,(TestNode *)pIVar9);
    std::__cxx11::string::~string((string *)&local_e0);
    ppuVar7 = (undefined **)std::__cxx11::string::~string((string *)&local_c0);
    this = local_e8;
  }
  for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
    pSVar6 = normalVerifiers[lVar12];
    pIVar9 = (InitialBooleanTestCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"transform_feedback_paused_initial",&local_e9);
    std::operator+(&local_e0,&local_c0,pSVar6->m_testNamePostfix);
    Functional::anon_unknown_0::InitialBooleanTestCase::InitialBooleanTestCase
              (pIVar9,pCVar4,pSVar6,local_e0._M_dataplus._M_p,"initial TRANSFORM_FEEDBACK_PAUSED",
               0x8e23,false);
    tcu::TestNode::addChild((TestNode *)local_e8,(TestNode *)pIVar9);
    std::__cxx11::string::~string((string *)&local_e0);
    ppuVar7 = (undefined **)std::__cxx11::string::~string((string *)&local_c0);
    this = local_e8;
  }
  for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
    pSVar6 = normalVerifiers[lVar12];
    pTVar10 = (TransformFeedbackTestCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"transform_feedback",&local_e9);
    std::operator+(&local_e0,&local_c0,pSVar6->m_testNamePostfix);
    Functional::anon_unknown_0::TransformFeedbackTestCase::TransformFeedbackTestCase
              (pTVar10,pCVar4,pSVar6,local_e0._M_dataplus._M_p,
               "Test TRANSFORM_FEEDBACK_ACTIVE and TRANSFORM_FEEDBACK_PAUSED");
    (pTVar10->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_01e33818;
    tcu::TestNode::addChild((TestNode *)local_e8,(TestNode *)pTVar10);
    std::__cxx11::string::~string((string *)&local_e0);
    ppuVar7 = (undefined **)std::__cxx11::string::~string((string *)&local_c0);
    this = local_e8;
  }
  for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
    pSVar6 = normalVerifiers[lVar12];
    pTVar10 = (TransformFeedbackTestCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"transform_feedback_implicit_resume",&local_e9);
    std::operator+(&local_e0,&local_c0,pSVar6->m_testNamePostfix);
    Functional::anon_unknown_0::TransformFeedbackTestCase::TransformFeedbackTestCase
              (pTVar10,pCVar4,pSVar6,local_e0._M_dataplus._M_p,
               "EndTransformFeedback performs an implicit ResumeTransformFeedback.");
    (pTVar10->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_01e338d8;
    tcu::TestNode::addChild((TestNode *)local_e8,(TestNode *)pTVar10);
    std::__cxx11::string::~string((string *)&local_e0);
    ppuVar7 = (undefined **)std::__cxx11::string::~string((string *)&local_c0);
    this = local_e8;
  }
  return (int)ppuVar7;
}

Assistant:

void BooleanStateQueryTests::init (void)
{
	DE_ASSERT(m_verifierIsEnabled == DE_NULL);
	DE_ASSERT(m_verifierBoolean == DE_NULL);
	DE_ASSERT(m_verifierInteger == DE_NULL);
	DE_ASSERT(m_verifierInteger64 == DE_NULL);
	DE_ASSERT(m_verifierFloat == DE_NULL);

	m_verifierIsEnabled		= new IsEnabledVerifier		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierBoolean		= new GetBooleanVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierInteger		= new GetIntegerVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierInteger64		= new GetInteger64Verifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierFloat			= new GetFloatVerifier		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());

	StateVerifier* isEnabledVerifiers[] = {m_verifierIsEnabled, m_verifierBoolean, m_verifierInteger, m_verifierInteger64, m_verifierFloat};
	StateVerifier* normalVerifiers[] = {m_verifierBoolean, m_verifierInteger, m_verifierInteger64, m_verifierFloat};

	struct StateBoolean
	{
		const char*		name;
		const char*		description;
		GLenum			targetName;
		bool			value;
	};
	const StateBoolean isEnableds[] =
	{
		{ "primitive_restart_fixed_index",	"PRIMITIVE_RESTART_FIXED_INDEX",	GL_PRIMITIVE_RESTART_FIXED_INDEX,	false},
		{ "rasterizer_discard",				"RASTERIZER_DISCARD",				GL_RASTERIZER_DISCARD,				false},
		{ "cull_face",						"CULL_FACE",						GL_CULL_FACE,						false},
		{ "polygon_offset_fill",			"POLYGON_OFFSET_FILL",				GL_POLYGON_OFFSET_FILL,				false},
		{ "sample_alpha_to_coverage",		"SAMPLE_ALPHA_TO_COVERAGE",			GL_SAMPLE_ALPHA_TO_COVERAGE,		false},
		{ "sample_coverage",				"SAMPLE_COVERAGE",					GL_SAMPLE_COVERAGE,					false},
		{ "scissor_test",					"SCISSOR_TEST",						GL_SCISSOR_TEST,					false},
		{ "stencil_test",					"STENCIL_TEST",						GL_STENCIL_TEST,					false},
		{ "depth_test",						"DEPTH_TEST",						GL_DEPTH_TEST,						false},
		{ "blend",							"BLEND",							GL_BLEND,							false},
		{ "dither",							"DITHER",							GL_DITHER,							true },
	};
	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(isEnableds); testNdx++)
	{
		FOR_EACH_VERIFIER(isEnabledVerifiers, addChild(new IsEnabledStateTestCase(m_context, verifier, (std::string(isEnableds[testNdx].name) + verifier->getTestNamePostfix()).c_str(), isEnableds[testNdx].description, isEnableds[testNdx].targetName, isEnableds[testNdx].value)));
	}

	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ColorMaskTestCase							(m_context, verifier, (std::string("color_writemask")						+ verifier->getTestNamePostfix()).c_str(), "COLOR_WRITEMASK")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new DepthWriteMaskTestCase						(m_context, verifier, (std::string("depth_writemask")						+ verifier->getTestNamePostfix()).c_str(), "DEPTH_WRITEMASK")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new SampleCoverageInvertTestCase				(m_context, verifier, (std::string("sample_coverage_invert")				+ verifier->getTestNamePostfix()).c_str(), "SAMPLE_COVERAGE_INVERT")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new InitialBooleanTestCase						(m_context, verifier, (std::string("shader_compiler")						+ verifier->getTestNamePostfix()).c_str(), "SHADER_COMPILER",						GL_SHADER_COMPILER, true)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new InitialBooleanTestCase						(m_context, verifier, (std::string("transform_feedback_active_initial")		+ verifier->getTestNamePostfix()).c_str(), "initial TRANSFORM_FEEDBACK_ACTIVE",		GL_TRANSFORM_FEEDBACK_ACTIVE, false)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new InitialBooleanTestCase						(m_context, verifier, (std::string("transform_feedback_paused_initial")		+ verifier->getTestNamePostfix()).c_str(), "initial TRANSFORM_FEEDBACK_PAUSED",		GL_TRANSFORM_FEEDBACK_PAUSED, false)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new TransformFeedbackBasicTestCase				(m_context, verifier, (std::string("transform_feedback")					+ verifier->getTestNamePostfix()).c_str())));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new TransformFeedbackImplicitResumeTestCase		(m_context, verifier, (std::string("transform_feedback_implicit_resume")	+ verifier->getTestNamePostfix()).c_str())));
}